

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O2

int SaveEXRImageToFile(EXRImage *exr_image,EXRHeader *exr_header,char *filename,char **err)

{
  FILE *__stream;
  size_t __n;
  size_t sVar1;
  allocator<char> *__a;
  uchar *__ptr;
  int iVar2;
  allocator<char> local_51;
  uchar *mem;
  string local_48;
  
  if ((filename == (char *)0x0 || exr_image == (EXRImage *)0x0) ||
     (exr_header->compression_type < 0)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"Invalid argument for SaveEXRImageToFile",(allocator<char> *)&mem
              );
    tinyexr::SetErrorMessage(&local_48,err);
    std::__cxx11::string::~string((string *)&local_48);
    iVar2 = -3;
  }
  else if (exr_header->compression_type == 0x80) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"ZFP compression is not supported in this build",
               (allocator<char> *)&mem);
    tinyexr::SetErrorMessage(&local_48,err);
    std::__cxx11::string::~string((string *)&local_48);
    iVar2 = -10;
  }
  else {
    __stream = fopen(filename,"wb");
    if (__stream == (FILE *)0x0) {
      __a = (allocator<char> *)&mem;
    }
    else {
      mem = (uchar *)0x0;
      __n = SaveEXRImageToMemory(exr_image,exr_header,&mem,err);
      if (__n == 0) {
        fclose(__stream);
        return -0xc;
      }
      if (mem == (uchar *)0x0) {
        __ptr = (uchar *)0x0;
        sVar1 = 0;
      }
      else {
        sVar1 = fwrite(mem,1,__n,__stream);
        __ptr = mem;
      }
      free(__ptr);
      fclose(__stream);
      if (sVar1 == __n) {
        return 0;
      }
      __a = &local_51;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"Cannot write a file",__a);
    tinyexr::SetErrorMessage(&local_48,err);
    std::__cxx11::string::~string((string *)&local_48);
    iVar2 = -0xb;
  }
  return iVar2;
}

Assistant:

int SaveEXRImageToFile(const EXRImage *exr_image, const EXRHeader *exr_header,
                       const char *filename, const char **err) {
  if (exr_image == NULL || filename == NULL ||
      exr_header->compression_type < 0) {
    tinyexr::SetErrorMessage("Invalid argument for SaveEXRImageToFile", err);
    return TINYEXR_ERROR_INVALID_ARGUMENT;
  }

#if !TINYEXR_USE_PIZ
  if (exr_header->compression_type == TINYEXR_COMPRESSIONTYPE_PIZ) {
    tinyexr::SetErrorMessage("PIZ compression is not supported in this build",
                             err);
    return TINYEXR_ERROR_UNSUPPORTED_FEATURE;
  }
#endif

#if !TINYEXR_USE_ZFP
  if (exr_header->compression_type == TINYEXR_COMPRESSIONTYPE_ZFP) {
    tinyexr::SetErrorMessage("ZFP compression is not supported in this build",
                             err);
    return TINYEXR_ERROR_UNSUPPORTED_FEATURE;
  }
#endif

#ifdef _WIN32
  FILE *fp = NULL;
  fopen_s(&fp, filename, "wb");
#else
  FILE *fp = fopen(filename, "wb");
#endif
  if (!fp) {
    tinyexr::SetErrorMessage("Cannot write a file", err);
    return TINYEXR_ERROR_CANT_WRITE_FILE;
  }

  unsigned char *mem = NULL;
  size_t mem_size = SaveEXRImageToMemory(exr_image, exr_header, &mem, err);
  if (mem_size == 0) {
    fclose(fp);
    return TINYEXR_ERROR_SERIALZATION_FAILED;
  }

  size_t written_size = 0;
  if ((mem_size > 0) && mem) {
    written_size = fwrite(mem, 1, mem_size, fp);
  }
  free(mem);

  fclose(fp);

  if (written_size != mem_size) {
    tinyexr::SetErrorMessage("Cannot write a file", err);
    return TINYEXR_ERROR_CANT_WRITE_FILE;
  }

  return TINYEXR_SUCCESS;
}